

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  size_t sVar2;
  float *pfVar3;
  Ref<embree::Geometry> *pRVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [12];
  vbool<4> vVar30;
  uint uVar31;
  float *vertices;
  ulong uVar32;
  Scene *pSVar33;
  RTCRayN *pRVar34;
  undefined4 uVar35;
  int iVar36;
  RTCIntersectArguments *pRVar37;
  long lVar38;
  ulong uVar39;
  NodeRef root;
  size_t sVar40;
  size_t sVar41;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar42;
  Scene *pSVar43;
  ulong uVar44;
  NodeRef *pNVar45;
  bool bVar46;
  float fVar47;
  float fVar65;
  float fVar66;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar67;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar75;
  float fVar76;
  undefined1 auVar69 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar70;
  float fVar77;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  float fVar86;
  float fVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar81;
  float fVar88;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar95;
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar96;
  float fVar97;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar94 [16];
  float fVar104;
  float fVar108;
  float fVar109;
  undefined1 auVar105 [16];
  float fVar110;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [16];
  float fVar118;
  float fVar119;
  uint uVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar139;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  uint uVar145;
  float fVar146;
  float fVar147;
  uint uVar150;
  float fVar151;
  float fVar152;
  uint uVar153;
  float fVar154;
  float fVar155;
  uint uVar156;
  float fVar157;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  uint uVar161;
  float fVar162;
  float fVar163;
  uint uVar164;
  float fVar165;
  float fVar166;
  uint uVar167;
  float fVar168;
  float fVar169;
  uint uVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar176;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  Precalculations pre;
  undefined1 local_1a78 [16];
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  vbool<4> terminated;
  undefined1 local_19e8 [16];
  BVH *local_19d8;
  Intersectors *local_19d0;
  Scene *local_19c8;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 uStack_1810;
  longlong local_1788;
  longlong lStack_1780;
  longlong local_1778;
  longlong lStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined4 local_1718;
  undefined4 uStack_1714;
  undefined4 uStack_1710;
  undefined4 uStack_170c;
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_19d8 = (BVH *)This->ptr;
  uVar32 = (local_19d8->root).ptr;
  if (uVar32 != 8) {
    pRVar37 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar37 = context->args,
       (pRVar37->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent((BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
                        *)valid_i,(vint<4> *)This,(Intersectors *)ray,(RayK<4> *)context,
                       (RayQueryContext *)local_19d8);
      return;
    }
    auVar141._8_4_ = 0xffffffff;
    auVar141._0_8_ = 0xffffffffffffffff;
    auVar141._12_4_ = 0xffffffff;
    auVar121 = *(undefined1 (*) [16])(ray + 0x80);
    uVar161 = -(uint)(0.0 <= auVar121._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar164 = -(uint)(0.0 <= auVar121._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar167 = -(uint)(0.0 <= auVar121._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar170 = -(uint)(0.0 <= auVar121._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar69._4_4_ = uVar164;
    auVar69._0_4_ = uVar161;
    auVar69._8_4_ = uVar167;
    auVar69._12_4_ = uVar170;
    iVar36 = movmskps((int)pRVar37,auVar69);
    if (iVar36 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar145 = (uint)DAT_01f7b6c0;
      uVar150 = DAT_01f7b6c0._4_4_;
      uVar153 = DAT_01f7b6c0._8_4_;
      uVar156 = DAT_01f7b6c0._12_4_;
      auVar135 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar149._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar150) < 1e-18);
      auVar149._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar145) < 1e-18);
      auVar149._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar153) < 1e-18);
      auVar149._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar156) < 1e-18);
      auVar92 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar48._4_4_ = -(uint)((float)(tray.dir.field_0._20_4_ & uVar150) < 1e-18);
      auVar48._0_4_ = -(uint)((float)(tray.dir.field_0._16_4_ & uVar145) < 1e-18);
      auVar69 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar135,_DAT_01fab950,auVar149);
      auVar48._8_4_ = -(uint)((float)(tray.dir.field_0._24_4_ & uVar153) < 1e-18);
      auVar48._12_4_ = -(uint)((float)(tray.dir.field_0._28_4_ & uVar156) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar92,_DAT_01fab950,auVar48);
      auVar92._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar150) < 1e-18);
      auVar92._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar145) < 1e-18);
      auVar92._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar153) < 1e-18);
      auVar92._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar156) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar69,_DAT_01fab950,auVar92);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar135._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar135._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar135._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar135._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar135);
      auVar49._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar49._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar49._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar49._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar49);
      auVar69 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar121 = maxps(auVar121,ZEXT816(0));
      auVar50._4_4_ = uVar164;
      auVar50._0_4_ = uVar161;
      auVar50._8_4_ = uVar167;
      auVar50._12_4_ = uVar170;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar69,auVar50);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar121,auVar50);
      auVar121._4_4_ = uVar164;
      auVar121._0_4_ = uVar161;
      auVar121._8_4_ = uVar167;
      auVar121._12_4_ = uVar170;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar141 ^ auVar121);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar145 = 3;
      }
      else {
        uVar145 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar45 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar42 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = uVar32;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      aVar176 = _DAT_01f7a9f0;
      local_19d0 = This;
LAB_00db821b:
      do {
        do {
          root.ptr = pNVar45[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00db8e3c;
          pNVar45 = pNVar45 + -1;
          paVar42 = paVar42 + -1;
          aVar70.v = *(__m128 *)paVar42->v;
          auVar51._4_4_ = -(uint)(aVar70.v[1] < tray.tfar.field_0.v[1]);
          auVar51._0_4_ = -(uint)(aVar70.v[0] < tray.tfar.field_0.v[0]);
          auVar51._8_4_ = -(uint)(aVar70.v[2] < tray.tfar.field_0.v[2]);
          auVar51._12_4_ = -(uint)(aVar70._12_4_ < tray.tfar.field_0.v[3]);
          uVar150 = movmskps((int)uVar32,auVar51);
          uVar32 = (ulong)uVar150;
        } while (uVar150 == 0);
        uVar44 = (ulong)(byte)uVar150;
        if (uVar145 < (uint)POPCOUNT(uVar150 & 0xff)) {
LAB_00db825b:
          do {
            vVar30.field_0 = terminated.field_0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00db8e3c;
              auVar56._4_4_ = -(uint)(aVar70.v[1] < tray.tfar.field_0.v[1]);
              auVar56._0_4_ = -(uint)(aVar70.v[0] < tray.tfar.field_0.v[0]);
              auVar56._8_4_ = -(uint)(aVar70.v[2] < tray.tfar.field_0.v[2]);
              auVar56._12_4_ = -(uint)(aVar70.v[3] < tray.tfar.field_0.v[3]);
              uVar150 = movmskps((int)uVar32,auVar56);
              uVar32 = (ulong)uVar150;
              if (uVar150 == 0) goto LAB_00db821b;
              uVar32 = (ulong)((uint)root.ptr & 0xf);
              if (uVar32 == 8) goto LAB_00db8d42;
              auVar57._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar57._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar57._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar38 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              valid_i = (vint<4> *)0x0;
              goto LAB_00db8455;
            }
            lVar38 = 0;
            sVar41 = 8;
            aVar70 = aVar176;
            do {
              sVar2 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar38 * 8);
              sVar40 = sVar41;
              if (sVar2 == 8) break;
              fVar133 = *(float *)(root.ptr + 0x20 + lVar38 * 4);
              fVar127 = *(float *)(root.ptr + 0x30 + lVar38 * 4);
              fVar129 = *(float *)(root.ptr + 0x40 + lVar38 * 4);
              fVar131 = *(float *)(root.ptr + 0x50 + lVar38 * 4);
              auVar79._0_8_ =
                   CONCAT44((fVar133 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_,
                            (fVar133 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_);
              auVar79._8_4_ = (fVar133 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar79._12_4_ = (fVar133 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_
              ;
              auVar52._0_8_ =
                   CONCAT44((fVar129 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_,
                            (fVar129 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_);
              auVar52._8_4_ = (fVar129 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
              auVar52._12_4_ = (fVar129 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_
              ;
              fVar133 = *(float *)(root.ptr + 0x60 + lVar38 * 4);
              auVar113._0_8_ =
                   CONCAT44((fVar133 - (float)tray.org.field_0._36_4_) *
                            (float)tray.rdir.field_0._36_4_,
                            (fVar133 - (float)tray.org.field_0._32_4_) *
                            (float)tray.rdir.field_0._32_4_);
              auVar113._8_4_ =
                   (fVar133 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              auVar113._12_4_ =
                   (fVar133 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              auVar93._0_4_ = (fVar127 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_;
              auVar93._4_4_ = (fVar127 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_;
              auVar93._8_4_ = (fVar127 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar93._12_4_ = (fVar127 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_
              ;
              auVar105._0_4_ = (fVar131 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_
              ;
              auVar105._4_4_ = (fVar131 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_
              ;
              auVar105._8_4_ = (fVar131 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_
              ;
              auVar105._12_4_ =
                   (fVar131 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
              fVar133 = *(float *)(root.ptr + 0x70 + lVar38 * 4);
              fVar127 = (fVar133 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
              ;
              fVar129 = (fVar133 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
              ;
              fVar131 = (fVar133 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
              ;
              fVar133 = (fVar133 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
              ;
              auVar122._8_4_ = auVar79._8_4_;
              auVar122._0_8_ = auVar79._0_8_;
              auVar122._12_4_ = auVar79._12_4_;
              auVar121 = minps(auVar122,auVar93);
              auVar136._8_4_ = auVar52._8_4_;
              auVar136._0_8_ = auVar52._0_8_;
              auVar136._12_4_ = auVar52._12_4_;
              auVar69 = minps(auVar136,auVar105);
              auVar121 = maxps(auVar121,auVar69);
              auVar137._8_4_ = auVar113._8_4_;
              auVar137._0_8_ = auVar113._0_8_;
              auVar137._12_4_ = auVar113._12_4_;
              auVar7._4_4_ = fVar129;
              auVar7._0_4_ = fVar127;
              auVar7._8_4_ = fVar131;
              auVar7._12_4_ = fVar133;
              auVar69 = minps(auVar137,auVar7);
              auVar121 = maxps(auVar121,auVar69);
              auVar123._0_8_ = CONCAT44(auVar121._4_4_ * 0.99999964,auVar121._0_4_ * 0.99999964);
              auVar123._8_4_ = auVar121._8_4_ * 0.99999964;
              auVar123._12_4_ = auVar121._12_4_ * 0.99999964;
              auVar69 = maxps(auVar79,auVar93);
              auVar121 = maxps(auVar52,auVar105);
              auVar121 = minps(auVar69,auVar121);
              auVar8._4_4_ = fVar129;
              auVar8._0_4_ = fVar127;
              auVar8._8_4_ = fVar131;
              auVar8._12_4_ = fVar133;
              auVar69 = maxps(auVar113,auVar8);
              auVar121 = minps(auVar121,auVar69);
              auVar80._0_4_ = auVar121._0_4_ * 1.0000004;
              auVar80._4_4_ = auVar121._4_4_ * 1.0000004;
              auVar80._8_4_ = auVar121._8_4_ * 1.0000004;
              auVar80._12_4_ = auVar121._12_4_ * 1.0000004;
              auVar53._8_4_ = auVar123._8_4_;
              auVar53._0_8_ = auVar123._0_8_;
              auVar53._12_4_ = auVar123._12_4_;
              auVar121 = maxps(auVar53,(undefined1  [16])tray.tnear.field_0);
              auVar69 = minps(auVar80,(undefined1  [16])tray.tfar.field_0);
              auVar54._4_4_ = -(uint)(auVar121._4_4_ <= auVar69._4_4_);
              auVar54._0_4_ = -(uint)(auVar121._0_4_ <= auVar69._0_4_);
              auVar54._8_4_ = -(uint)(auVar121._8_4_ <= auVar69._8_4_);
              auVar54._12_4_ = -(uint)(auVar121._12_4_ <= auVar69._12_4_);
              uVar150 = movmskps((int)valid_i,auVar54);
              valid_i = (vint<4> *)(ulong)uVar150;
              aVar81 = aVar70;
              if ((uVar150 != 0) &&
                 (aVar81.v = (__m128)blendvps(aVar176.v,auVar123,auVar54), sVar40 = sVar2,
                 sVar41 != 8)) {
                pNVar45->ptr = sVar41;
                pNVar45 = pNVar45 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar42->v = aVar70;
                paVar42 = paVar42 + 1;
              }
              aVar70 = aVar81;
              lVar38 = lVar38 + 1;
              sVar41 = sVar40;
            } while (lVar38 != 4);
            uVar32 = 4;
            if (sVar40 == 8) goto LAB_00db83f0;
            auVar55._4_4_ = -(uint)(aVar70.v[1] < tray.tfar.field_0.v[1]);
            auVar55._0_4_ = -(uint)(aVar70.v[0] < tray.tfar.field_0.v[0]);
            auVar55._8_4_ = -(uint)(aVar70.v[2] < tray.tfar.field_0.v[2]);
            auVar55._12_4_ = -(uint)(aVar70.v[3] < tray.tfar.field_0.v[3]);
            uVar35 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar55);
            root.ptr = sVar40;
          } while ((byte)uVar145 < (byte)POPCOUNT(uVar35));
          pNVar45->ptr = sVar40;
          pNVar45 = pNVar45 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar42->v = aVar70;
          paVar42 = paVar42 + 1;
        }
        else {
          do {
            sVar41 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> sVar41 & 1) == 0; sVar41 = sVar41 + 1) {
              }
            }
            valid_i = (vint<4> *)local_19d0;
            bVar46 = occluded1(local_19d0,local_19d8,root,sVar41,&pre,ray,&tray,context);
            if (bVar46) {
              terminated.field_0.i[sVar41] = -1;
            }
            uVar32 = uVar44 - 1;
            uVar44 = uVar44 & uVar32;
          } while (uVar44 != 0);
          iVar36 = movmskps((int)uVar32,(undefined1  [16])terminated.field_0);
          if (iVar36 == 0xf) {
            uVar32 = 3;
          }
          else {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar32 = 2;
          }
          aVar176 = _DAT_01f7a9f0;
          if (uVar145 < (uint)POPCOUNT(uVar150 & 0xff)) goto LAB_00db825b;
        }
LAB_00db83f0:
      } while (((int)uVar32 == 4) || ((int)uVar32 == 2));
LAB_00db8e3c:
      auVar64._4_4_ = uVar164 & terminated.field_0.i[1];
      auVar64._0_4_ = uVar161 & terminated.field_0.i[0];
      auVar64._8_4_ = uVar167 & terminated.field_0.i[2];
      auVar64._12_4_ = uVar170 & terminated.field_0.i[3];
      auVar121 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar64);
      *(undefined1 (*) [16])(ray + 0x80) = auVar121;
    }
  }
  return;
  while( true ) {
    valid_i = (vint<4> *)((long)&((Intersectors *)valid_i)->ptr + 1);
    lVar38 = lVar38 + 0x50;
    auVar57 = auVar63;
    if ((Intersectors *)(uVar32 - 8) <= valid_i) break;
LAB_00db8455:
    v = (vuint<4> *)((long)valid_i * 0x50 + (root.ptr & 0xfffffffffffffff0));
    pSVar33 = context->scene;
    pSVar43 = (Scene *)0x0;
    local_1a78 = auVar57;
    local_19c8 = pSVar33;
    while (*(int *)(lVar38 + (long)pSVar43 * 4) != -1) {
      pfVar3 = (local_19c8->vertices).items[*(uint *)(lVar38 + -0x10 + (long)pSVar43 * 4)];
      uVar44 = (ulong)*(uint *)(lVar38 + -0x40 + (long)pSVar43 * 4);
      uVar39 = (ulong)*(uint *)(lVar38 + -0x30 + (long)pSVar43 * 4);
      fVar133 = pfVar3[uVar44];
      fVar127 = pfVar3[uVar44 + 1];
      fVar129 = pfVar3[uVar44 + 2];
      fVar131 = pfVar3[uVar39];
      fVar88 = pfVar3[uVar39 + 1];
      fVar101 = pfVar3[uVar39 + 2];
      uVar44 = (ulong)*(uint *)(lVar38 + -0x20 + (long)pSVar43 * 4);
      fVar110 = pfVar3[uVar44];
      fVar67 = pfVar3[uVar44 + 1];
      fVar77 = pfVar3[uVar44 + 2];
      local_1778 = v[3].field_0.v[0];
      lStack_1770 = v[3].field_0.v[1];
      local_1788 = v[4].field_0.v[0];
      lStack_1780 = v[4].field_0.v[1];
      fVar104 = *(float *)ray;
      fVar108 = *(float *)(ray + 4);
      fVar109 = *(float *)(ray + 8);
      fVar15 = *(float *)(ray + 0xc);
      fVar47 = *(float *)(ray + 0x10);
      fVar65 = *(float *)(ray + 0x14);
      fVar66 = *(float *)(ray + 0x18);
      fVar16 = *(float *)(ray + 0x1c);
      fVar68 = *(float *)(ray + 0x20);
      fVar75 = *(float *)(ray + 0x24);
      fVar76 = *(float *)(ray + 0x28);
      fVar17 = *(float *)(ray + 0x2c);
      fVar187 = fVar133 - fVar104;
      fVar188 = fVar133 - fVar108;
      fVar189 = fVar133 - fVar109;
      fVar133 = fVar133 - fVar15;
      fVar146 = fVar127 - fVar47;
      fVar151 = fVar127 - fVar65;
      fVar154 = fVar127 - fVar66;
      fVar127 = fVar127 - fVar16;
      fVar158 = fVar129 - fVar68;
      fVar159 = fVar129 - fVar75;
      fVar160 = fVar129 - fVar76;
      fVar129 = fVar129 - fVar17;
      fVar180 = fVar131 - fVar104;
      fVar182 = fVar131 - fVar108;
      fVar184 = fVar131 - fVar109;
      fVar131 = fVar131 - fVar15;
      fVar78 = fVar88 - fVar47;
      fVar86 = fVar88 - fVar65;
      fVar87 = fVar88 - fVar66;
      fVar88 = fVar88 - fVar16;
      fVar89 = fVar101 - fVar68;
      fVar95 = fVar101 - fVar75;
      fVar98 = fVar101 - fVar76;
      fVar101 = fVar101 - fVar17;
      fVar104 = fVar110 - fVar104;
      fVar108 = fVar110 - fVar108;
      fVar109 = fVar110 - fVar109;
      fVar110 = fVar110 - fVar15;
      fVar47 = fVar67 - fVar47;
      fVar65 = fVar67 - fVar65;
      fVar66 = fVar67 - fVar66;
      fVar67 = fVar67 - fVar16;
      fVar68 = fVar77 - fVar68;
      fVar75 = fVar77 - fVar75;
      fVar76 = fVar77 - fVar76;
      fVar77 = fVar77 - fVar17;
      fVar90 = fVar104 - fVar187;
      fVar96 = fVar108 - fVar188;
      fVar99 = fVar109 - fVar189;
      fVar102 = fVar110 - fVar133;
      fVar173 = fVar47 - fVar146;
      fVar177 = fVar65 - fVar151;
      fVar178 = fVar66 - fVar154;
      fVar179 = fVar67 - fVar127;
      fVar162 = fVar68 - fVar158;
      fVar165 = fVar75 - fVar159;
      fVar168 = fVar76 - fVar160;
      fVar171 = fVar77 - fVar129;
      fVar15 = *(float *)(ray + 0x60);
      fVar16 = *(float *)(ray + 100);
      fVar17 = *(float *)(ray + 0x68);
      fVar18 = *(float *)(ray + 0x6c);
      fVar19 = *(float *)(ray + 0x50);
      fVar20 = *(float *)(ray + 0x54);
      fVar21 = *(float *)(ray + 0x58);
      auVar29 = *(undefined1 (*) [12])(ray + 0x50);
      fVar22 = *(float *)(ray + 0x5c);
      fVar23 = *(float *)(ray + 0x40);
      fVar24 = *(float *)(ray + 0x44);
      fVar25 = *(float *)(ray + 0x48);
      fVar26 = *(float *)(ray + 0x4c);
      fVar128 = (fVar173 * (fVar68 + fVar158) - (fVar47 + fVar146) * fVar162) * fVar23 +
                ((fVar104 + fVar187) * fVar162 - (fVar68 + fVar158) * fVar90) * fVar19 +
                (fVar90 * (fVar47 + fVar146) - (fVar104 + fVar187) * fVar173) * fVar15;
      fVar130 = (fVar177 * (fVar75 + fVar159) - (fVar65 + fVar151) * fVar165) * fVar24 +
                ((fVar108 + fVar188) * fVar165 - (fVar75 + fVar159) * fVar96) * fVar20 +
                (fVar96 * (fVar65 + fVar151) - (fVar108 + fVar188) * fVar177) * fVar16;
      fVar132 = (fVar178 * (fVar76 + fVar160) - (fVar66 + fVar154) * fVar168) * fVar25 +
                ((fVar109 + fVar189) * fVar168 - (fVar76 + fVar160) * fVar99) * fVar21 +
                (fVar99 * (fVar66 + fVar154) - (fVar109 + fVar189) * fVar178) * fVar17;
      fVar134 = (fVar179 * (fVar77 + fVar129) - (fVar67 + fVar127) * fVar171) * fVar26 +
                ((fVar110 + fVar133) * fVar171 - (fVar77 + fVar129) * fVar102) * fVar22 +
                (fVar102 * (fVar67 + fVar127) - (fVar110 + fVar133) * fVar179) * fVar18;
      fVar91 = fVar187 - fVar180;
      fVar97 = fVar188 - fVar182;
      fVar100 = fVar189 - fVar184;
      fVar103 = fVar133 - fVar131;
      fVar139 = fVar146 - fVar78;
      fVar142 = fVar151 - fVar86;
      fVar143 = fVar154 - fVar87;
      fVar144 = fVar127 - fVar88;
      fVar111 = fVar158 - fVar89;
      fVar114 = fVar159 - fVar95;
      fVar116 = fVar160 - fVar98;
      fVar118 = fVar129 - fVar101;
      fVar163 = (fVar139 * (fVar158 + fVar89) - (fVar146 + fVar78) * fVar111) * fVar23 +
                ((fVar187 + fVar180) * fVar111 - (fVar158 + fVar89) * fVar91) * fVar19 +
                (fVar91 * (fVar146 + fVar78) - (fVar187 + fVar180) * fVar139) * fVar15;
      fVar166 = (fVar142 * (fVar159 + fVar95) - (fVar151 + fVar86) * fVar114) * fVar24 +
                ((fVar188 + fVar182) * fVar114 - (fVar159 + fVar95) * fVar97) * fVar20 +
                (fVar97 * (fVar151 + fVar86) - (fVar188 + fVar182) * fVar142) * fVar16;
      fVar169 = (fVar143 * (fVar160 + fVar98) - (fVar154 + fVar87) * fVar116) * fVar25 +
                ((fVar189 + fVar184) * fVar116 - (fVar160 + fVar98) * fVar100) * fVar21 +
                (fVar100 * (fVar154 + fVar87) - (fVar189 + fVar184) * fVar143) * fVar17;
      fVar172 = (fVar144 * (fVar129 + fVar101) - (fVar127 + fVar88) * fVar118) * fVar26 +
                ((fVar133 + fVar131) * fVar118 - (fVar129 + fVar101) * fVar103) * fVar22 +
                (fVar103 * (fVar127 + fVar88) - (fVar133 + fVar131) * fVar144) * fVar18;
      fVar147 = fVar180 - fVar104;
      fVar152 = fVar182 - fVar108;
      fVar155 = fVar184 - fVar109;
      fVar157 = fVar131 - fVar110;
      fVar112 = fVar78 - fVar47;
      fVar115 = fVar86 - fVar65;
      fVar117 = fVar87 - fVar66;
      fVar119 = fVar88 - fVar67;
      fVar181 = fVar89 - fVar68;
      fVar183 = fVar95 - fVar75;
      fVar185 = fVar98 - fVar76;
      fVar186 = fVar101 - fVar77;
      auVar82._0_4_ =
           (fVar112 * (fVar68 + fVar89) - (fVar47 + fVar78) * fVar181) * fVar23 +
           ((fVar104 + fVar180) * fVar181 - (fVar68 + fVar89) * fVar147) * fVar19 +
           (fVar147 * (fVar47 + fVar78) - (fVar104 + fVar180) * fVar112) * fVar15;
      auVar82._4_4_ =
           (fVar115 * (fVar75 + fVar95) - (fVar65 + fVar86) * fVar183) * fVar24 +
           ((fVar108 + fVar182) * fVar183 - (fVar75 + fVar95) * fVar152) * fVar20 +
           (fVar152 * (fVar65 + fVar86) - (fVar108 + fVar182) * fVar115) * fVar16;
      auVar82._8_4_ =
           (fVar117 * (fVar76 + fVar98) - (fVar66 + fVar87) * fVar185) * fVar25 +
           ((fVar109 + fVar184) * fVar185 - (fVar76 + fVar98) * fVar155) * fVar21 +
           (fVar155 * (fVar66 + fVar87) - (fVar109 + fVar184) * fVar117) * fVar17;
      auVar82._12_4_ =
           (fVar119 * (fVar77 + fVar101) - (fVar67 + fVar88) * fVar186) * fVar26 +
           ((fVar110 + fVar131) * fVar186 - (fVar77 + fVar101) * fVar157) * fVar22 +
           (fVar157 * (fVar67 + fVar88) - (fVar110 + fVar131) * fVar119) * fVar18;
      fVar131 = fVar128 + fVar163 + auVar82._0_4_;
      fVar88 = fVar130 + fVar166 + auVar82._4_4_;
      auVar106._0_8_ = CONCAT44(fVar88,fVar131);
      auVar106._8_4_ = fVar132 + fVar169 + auVar82._8_4_;
      auVar106._12_4_ = fVar134 + fVar172 + auVar82._12_4_;
      auVar58._4_4_ = fVar130;
      auVar58._0_4_ = fVar128;
      auVar58._8_4_ = fVar132;
      auVar58._12_4_ = fVar134;
      auVar10._4_4_ = fVar166;
      auVar10._0_4_ = fVar163;
      auVar10._8_4_ = fVar169;
      auVar10._12_4_ = fVar172;
      auVar121 = minps(auVar58,auVar10);
      auVar121 = minps(auVar121,auVar82);
      auVar174._4_4_ = fVar130;
      auVar174._0_4_ = fVar128;
      auVar174._8_4_ = fVar132;
      auVar174._12_4_ = fVar134;
      auVar11._4_4_ = fVar166;
      auVar11._0_4_ = fVar163;
      auVar11._8_4_ = fVar169;
      auVar11._12_4_ = fVar172;
      auVar69 = maxps(auVar174,auVar11);
      auVar69 = maxps(auVar69,auVar82);
      fVar131 = ABS(fVar131) * 1.1920929e-07;
      fVar88 = ABS(fVar88) * 1.1920929e-07;
      auVar175._0_8_ =
           CONCAT44(-(uint)(auVar69._4_4_ <= fVar88 || -fVar88 <= auVar121._4_4_) & local_1a78._4_4_
                    ,-(uint)(auVar69._0_4_ <= fVar131 || -fVar131 <= auVar121._0_4_) &
                     local_1a78._0_4_);
      auVar175._8_4_ =
           -(uint)(auVar69._8_4_ <= ABS(auVar106._8_4_) * 1.1920929e-07 ||
                  -(ABS(auVar106._8_4_) * 1.1920929e-07) <= auVar121._8_4_) & local_1a78._8_4_;
      auVar175._12_4_ =
           -(uint)(auVar69._12_4_ <= ABS(auVar106._12_4_) * 1.1920929e-07 ||
                  -(ABS(auVar106._12_4_) * 1.1920929e-07) <= auVar121._12_4_) & local_1a78._12_4_;
      iVar36 = movmskps((int)v,auVar175);
      uVar150 = (uint)DAT_01f7b6c0;
      uVar153 = DAT_01f7b6c0._4_4_;
      uVar156 = DAT_01f7b6c0._8_4_;
      uVar120 = DAT_01f7b6c0._12_4_;
      if (iVar36 == 0) {
        auVar126._8_4_ = auVar175._8_4_;
        auVar126._0_8_ = auVar175._0_8_;
        auVar126._12_4_ = auVar175._12_4_;
      }
      else {
        auVar107._0_4_ = fVar173 * fVar111 - fVar139 * fVar162;
        auVar107._4_4_ = fVar177 * fVar114 - fVar142 * fVar165;
        auVar107._8_4_ = fVar178 * fVar116 - fVar143 * fVar168;
        auVar107._12_4_ = fVar179 * fVar118 - fVar144 * fVar171;
        auVar140._0_4_ = fVar139 * fVar181 - fVar112 * fVar111;
        auVar140._4_4_ = fVar142 * fVar183 - fVar115 * fVar114;
        auVar140._8_4_ = fVar143 * fVar185 - fVar117 * fVar116;
        auVar140._12_4_ = fVar144 * fVar186 - fVar119 * fVar118;
        local_1a58 = auVar29._0_4_;
        fStack_1a54 = auVar29._4_4_;
        fStack_1a50 = auVar29._8_4_;
        auVar59._4_4_ =
             -(uint)((float)((uint)(fVar142 * fVar165) & uVar153) <
                    (float)((uint)(fVar115 * fVar114) & uVar153));
        auVar59._0_4_ =
             -(uint)((float)((uint)(fVar139 * fVar162) & uVar150) <
                    (float)((uint)(fVar112 * fVar111) & uVar150));
        auVar59._8_4_ =
             -(uint)((float)((uint)(fVar143 * fVar168) & uVar156) <
                    (float)((uint)(fVar117 * fVar116) & uVar156));
        auVar59._12_4_ =
             -(uint)((float)((uint)(fVar144 * fVar171) & uVar120) <
                    (float)((uint)(fVar119 * fVar118) & uVar120));
        auVar141 = blendvps(auVar140,auVar107,auVar59);
        auVar138._0_4_ = fVar162 * fVar91 - fVar90 * fVar111;
        auVar138._4_4_ = fVar165 * fVar97 - fVar96 * fVar114;
        auVar138._8_4_ = fVar168 * fVar100 - fVar99 * fVar116;
        auVar138._12_4_ = fVar171 * fVar103 - fVar102 * fVar118;
        auVar148._0_4_ = fVar147 * fVar111 - fVar91 * fVar181;
        auVar148._4_4_ = fVar152 * fVar114 - fVar97 * fVar183;
        auVar148._8_4_ = fVar155 * fVar116 - fVar100 * fVar185;
        auVar148._12_4_ = fVar157 * fVar118 - fVar103 * fVar186;
        auVar60._4_4_ =
             -(uint)((float)((uint)(fVar96 * fVar114) & uVar153) <
                    (float)((uint)(fVar97 * fVar183) & uVar153));
        auVar60._0_4_ =
             -(uint)((float)((uint)(fVar90 * fVar111) & uVar150) <
                    (float)((uint)(fVar91 * fVar181) & uVar150));
        auVar60._8_4_ =
             -(uint)((float)((uint)(fVar99 * fVar116) & uVar156) <
                    (float)((uint)(fVar100 * fVar185) & uVar156));
        auVar60._12_4_ =
             -(uint)((float)((uint)(fVar102 * fVar118) & uVar120) <
                    (float)((uint)(fVar103 * fVar186) & uVar120));
        auVar149 = blendvps(auVar148,auVar138,auVar60);
        auVar94._0_4_ = fVar91 * fVar112 - fVar147 * fVar139;
        auVar94._4_4_ = fVar97 * fVar115 - fVar152 * fVar142;
        auVar94._8_4_ = fVar100 * fVar117 - fVar155 * fVar143;
        auVar94._12_4_ = fVar103 * fVar119 - fVar157 * fVar144;
        auVar61._4_4_ =
             -(uint)((float)((uint)(fVar97 * fVar177) & uVar153) <
                    (float)((uint)(fVar152 * fVar142) & uVar153));
        auVar61._0_4_ =
             -(uint)((float)((uint)(fVar91 * fVar173) & uVar150) <
                    (float)((uint)(fVar147 * fVar139) & uVar150));
        auVar61._8_4_ =
             -(uint)((float)((uint)(fVar100 * fVar178) & uVar156) <
                    (float)((uint)(fVar155 * fVar143) & uVar156));
        auVar61._12_4_ =
             -(uint)((float)((uint)(fVar103 * fVar179) & uVar120) <
                    (float)((uint)(fVar157 * fVar144) & uVar120));
        auVar9._4_4_ = fVar96 * fVar142 - fVar97 * fVar177;
        auVar9._0_4_ = fVar90 * fVar139 - fVar91 * fVar173;
        auVar9._8_4_ = fVar99 * fVar143 - fVar100 * fVar178;
        auVar9._12_4_ = fVar102 * fVar144 - fVar103 * fVar179;
        auVar69 = blendvps(auVar94,auVar9,auVar61);
        fVar131 = fVar23 * auVar141._0_4_ + local_1a58 * auVar149._0_4_ + fVar15 * auVar69._0_4_;
        fVar88 = fVar24 * auVar141._4_4_ + fStack_1a54 * auVar149._4_4_ + fVar16 * auVar69._4_4_;
        fVar101 = fVar25 * auVar141._8_4_ + fStack_1a50 * auVar149._8_4_ + fVar17 * auVar69._8_4_;
        fVar110 = fVar26 * auVar141._12_4_ + fVar22 * auVar149._12_4_ + fVar18 * auVar69._12_4_;
        auVar124._0_4_ = fVar131 + fVar131;
        auVar124._4_4_ = fVar88 + fVar88;
        auVar124._8_4_ = fVar101 + fVar101;
        auVar124._12_4_ = fVar110 + fVar110;
        auVar71._0_4_ = fVar158 * auVar69._0_4_;
        auVar71._4_4_ = fVar159 * auVar69._4_4_;
        auVar71._8_4_ = fVar160 * auVar69._8_4_;
        auVar71._12_4_ = fVar129 * auVar69._12_4_;
        fVar88 = fVar187 * auVar141._0_4_ + fVar146 * auVar149._0_4_ + auVar71._0_4_;
        fVar101 = fVar188 * auVar141._4_4_ + fVar151 * auVar149._4_4_ + auVar71._4_4_;
        fVar110 = fVar189 * auVar141._8_4_ + fVar154 * auVar149._8_4_ + auVar71._8_4_;
        fVar67 = fVar133 * auVar141._12_4_ + fVar127 * auVar149._12_4_ + auVar71._12_4_;
        auVar121 = rcpps(auVar71,auVar124);
        fVar133 = auVar121._0_4_;
        fVar127 = auVar121._4_4_;
        fVar129 = auVar121._8_4_;
        fVar131 = auVar121._12_4_;
        fVar133 = ((1.0 - auVar124._0_4_ * fVar133) * fVar133 + fVar133) * (fVar88 + fVar88);
        fVar127 = ((1.0 - auVar124._4_4_ * fVar127) * fVar127 + fVar127) * (fVar101 + fVar101);
        fVar129 = ((1.0 - auVar124._8_4_ * fVar129) * fVar129 + fVar129) * (fVar110 + fVar110);
        fVar131 = ((1.0 - auVar124._12_4_ * fVar131) * fVar131 + fVar131) * (fVar67 + fVar67);
        bVar13 = fVar133 <= *(float *)(ray + 0x80) && *(float *)(ray + 0x30) <= fVar133;
        auVar82._0_4_ = (float)-(uint)bVar13;
        bVar14 = fVar127 <= *(float *)(ray + 0x84) && *(float *)(ray + 0x34) <= fVar127;
        auVar82._4_4_ = (float)-(uint)bVar14;
        bVar12 = fVar129 <= *(float *)(ray + 0x88) && *(float *)(ray + 0x38) <= fVar129;
        auVar82._8_4_ = (float)-(uint)bVar12;
        bVar46 = fVar131 <= *(float *)(ray + 0x8c) && *(float *)(ray + 0x3c) <= fVar131;
        auVar82._12_4_ = (float)-(uint)bVar46;
        auVar125._0_4_ = (int)((uint)(auVar124._0_4_ != 0.0 && bVar13) * -0x80000000) >> 0x1f;
        auVar125._4_4_ = (int)((uint)(auVar124._4_4_ != 0.0 && bVar14) * -0x80000000) >> 0x1f;
        auVar125._8_4_ = (int)((uint)(auVar124._8_4_ != 0.0 && bVar12) * -0x80000000) >> 0x1f;
        auVar125._12_4_ = (int)((uint)(auVar124._12_4_ != 0.0 && bVar46) * -0x80000000) >> 0x1f;
        auVar126 = auVar125 & auVar175;
        iVar36 = movmskps(iVar36,auVar126);
        if (iVar36 != 0) {
          local_1848 = CONCAT44(fVar130,fVar128);
          uStack_1840 = CONCAT44(fVar134,fVar132);
          local_1858 = CONCAT44(fVar166,fVar163);
          uStack_1850 = CONCAT44(fVar172,fVar169);
          uStack_1810 = auVar106._8_8_;
          uStack_1860 = uStack_1810;
          local_18a8 = auVar69;
          local_1898 = auVar149;
          local_1888 = auVar141;
          local_1878 = fVar133;
          fStack_1874 = fVar127;
          fStack_1870 = fVar129;
          fStack_186c = fVar131;
          local_1868 = auVar106._0_8_;
        }
      }
      uVar31 = *(uint *)((long)&local_1778 + (long)pSVar43 * 4);
      pRVar4 = (context->scene->geometries).items;
      pGVar5 = pRVar4[uVar31].ptr;
      uVar1 = pGVar5->mask;
      auVar72._0_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x90)) == 0);
      auVar72._4_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x94)) == 0);
      auVar72._8_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x98)) == 0);
      auVar72._12_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x9c)) == 0);
      auVar73 = ~auVar72 & auVar126;
      iVar36 = movmskps((int)pRVar4,auVar73);
      aVar176 = _DAT_01f7a9f0;
      if (iVar36 != 0) {
        uVar35 = *(undefined4 *)((long)&local_1788 + (long)pSVar43 * 4);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar28._8_8_ = uStack_1860;
          auVar28._0_8_ = local_1868;
          fVar88 = (float)((ulong)local_1868 >> 0x20);
          fVar101 = (float)((ulong)uStack_1860 >> 0x20);
          auVar121 = rcpps(auVar82,auVar28);
          fVar133 = auVar121._0_4_;
          fVar127 = auVar121._4_4_;
          fVar129 = auVar121._8_4_;
          fVar131 = auVar121._12_4_;
          fVar133 = (float)(-(uint)(1e-18 <= (float)((uint)(float)local_1868 & uVar150)) &
                           (uint)(((float)DAT_01f7ba10 - (float)local_1868 * fVar133) * fVar133 +
                                 fVar133));
          fVar127 = (float)(-(uint)(1e-18 <= (float)((uint)fVar88 & uVar153)) &
                           (uint)((DAT_01f7ba10._4_4_ - fVar88 * fVar127) * fVar127 + fVar127));
          fVar129 = (float)(-(uint)(1e-18 <= (float)((uint)(float)uStack_1860 & uVar156)) &
                           (uint)((DAT_01f7ba10._8_4_ - (float)uStack_1860 * fVar129) * fVar129 +
                                 fVar129));
          fVar131 = (float)(-(uint)(1e-18 <= (float)((uint)fVar101 & uVar120)) &
                           (uint)((DAT_01f7ba10._12_4_ - fVar101 * fVar131) * fVar131 + fVar131));
          auVar83._0_4_ = (float)local_1848 * fVar133;
          auVar83._4_4_ = local_1848._4_4_ * fVar127;
          auVar83._8_4_ = (float)uStack_1840 * fVar129;
          auVar83._12_4_ = uStack_1840._4_4_ * fVar131;
          local_1738 = minps(auVar83,_DAT_01f7ba10);
          auVar62._0_4_ = fVar133 * (float)local_1858;
          auVar62._4_4_ = fVar127 * local_1858._4_4_;
          auVar62._8_4_ = fVar129 * (float)uStack_1850;
          auVar62._12_4_ = fVar131 * uStack_1850._4_4_;
          local_1728 = minps(auVar62,_DAT_01f7ba10);
          local_1708._4_4_ = uVar31;
          local_1708._0_4_ = uVar31;
          local_1708._8_4_ = uVar31;
          local_1708._12_4_ = uVar31;
          local_1768 = local_1888._0_8_;
          uStack_1760 = local_1888._8_8_;
          local_1758 = local_1898._0_8_;
          uStack_1750 = local_1898._8_8_;
          local_1748 = local_18a8;
          local_1718 = uVar35;
          uStack_1714 = uVar35;
          uStack_1710 = uVar35;
          uStack_170c = uVar35;
          local_16f8 = context->user->instID[0];
          uStack_16f4 = local_16f8;
          uStack_16f0 = local_16f8;
          uStack_16ec = local_16f8;
          local_16e8 = context->user->instPrimID[0];
          uStack_16e4 = local_16e8;
          uStack_16e0 = local_16e8;
          uStack_16dc = local_16e8;
          auVar121 = *(undefined1 (*) [16])(ray + 0x80);
          auVar27._4_4_ = fStack_1874;
          auVar27._0_4_ = local_1878;
          auVar27._8_4_ = fStack_1870;
          auVar27._12_4_ = fStack_186c;
          auVar69 = blendvps(auVar121,auVar27,auVar73);
          *(undefined1 (*) [16])(ray + 0x80) = auVar69;
          args.valid = (int *)local_19e8;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          pRVar34 = (RTCRayN *)pGVar5->occlusionFilterN;
          local_19e8 = auVar73;
          args.ray = (RTCRayN *)ray;
          if (pRVar34 != (RTCRayN *)0x0) {
            pRVar34 = (RTCRayN *)(*(code *)pRVar34)(&args);
          }
          if (local_19e8 == (undefined1  [16])0x0) {
            auVar84._8_4_ = 0xffffffff;
            auVar84._0_8_ = 0xffffffffffffffff;
            auVar84._12_4_ = 0xffffffff;
            auVar84 = auVar84 ^ _DAT_01f7ae20;
            aVar176 = _DAT_01f7a9f0;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&args);
            }
            aVar176 = _DAT_01f7a9f0;
            auVar74._0_4_ = -(uint)(local_19e8._0_4_ == 0);
            auVar74._4_4_ = -(uint)(local_19e8._4_4_ == 0);
            auVar74._8_4_ = -(uint)(local_19e8._8_4_ == 0);
            auVar74._12_4_ = -(uint)(local_19e8._12_4_ == 0);
            auVar84 = auVar74 ^ _DAT_01f7ae20;
            auVar69 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar74);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar69;
            pRVar34 = args.ray;
          }
          uVar31 = (uint)pRVar34;
          auVar85._0_4_ = auVar84._0_4_ << 0x1f;
          auVar85._4_4_ = auVar84._4_4_ << 0x1f;
          auVar85._8_4_ = auVar84._8_4_ << 0x1f;
          auVar85._12_4_ = auVar84._12_4_ << 0x1f;
          auVar73._0_4_ = auVar85._0_4_ >> 0x1f;
          auVar73._4_4_ = auVar85._4_4_ >> 0x1f;
          auVar73._8_4_ = auVar85._8_4_ >> 0x1f;
          auVar73._12_4_ = auVar85._12_4_ >> 0x1f;
          auVar121 = blendvps(auVar121,*(undefined1 (*) [16])(ray + 0x80),auVar85);
          *(undefined1 (*) [16])(ray + 0x80) = auVar121;
        }
        local_1a78 = ~auVar73 & local_1a78;
      }
      uVar150 = movmskps(uVar31,local_1a78);
      pSVar33 = (Scene *)(ulong)uVar150;
      if ((uVar150 == 0) ||
         (pSVar33 = (Scene *)((long)&(pSVar43->super_AccelN).super_Accel.super_AccelData.
                                     super_RefCount._vptr_RefCount + 1),
         bVar46 = (Scene *)0x2 < pSVar43, pSVar43 = pSVar33, bVar46)) break;
    }
    auVar63._0_4_ = auVar57._0_4_ & local_1a78._0_4_;
    auVar63._4_4_ = auVar57._4_4_ & local_1a78._4_4_;
    auVar63._8_4_ = auVar57._8_4_ & local_1a78._8_4_;
    auVar63._12_4_ = auVar57._12_4_ & local_1a78._12_4_;
    uVar150 = movmskps((int)pSVar33,auVar63);
    if (uVar150 == 0) break;
  }
  uVar32 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
  terminated.field_0._0_8_ = uVar32 ^ 0xffffffffffffffff;
  terminated.field_0.i[2] = auVar63._8_4_ ^ 0xffffffff;
  terminated.field_0.i[3] = auVar63._12_4_ ^ 0xffffffff;
LAB_00db8d42:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])vVar30.field_0 | (undefined1  [16])terminated.field_0);
  uVar150 = movmskps(uVar150,(undefined1  [16])terminated.field_0);
  uVar32 = (ulong)uVar150;
  if (uVar150 == 0xf) goto LAB_00db8e3c;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                (undefined1  [16])terminated.field_0);
  goto LAB_00db821b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }